

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O0

void __thiscall
DirectiveLoadMipsElf::DirectiveLoadMipsElf(DirectiveLoadMipsElf *this,path *fileName)

{
  FileManager *this_00;
  bool bVar1;
  element_type *this_01;
  path *this_02;
  shared_ptr<AssemblerFile> local_78;
  shared_ptr<MipsElfFile> local_68;
  path local_58;
  shared_ptr<MipsElfFile> local_28;
  path *local_18;
  path *fileName_local;
  DirectiveLoadMipsElf *this_local;
  
  local_18 = fileName;
  fileName_local = (path *)this;
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__DirectiveLoadMipsElf_002abe18;
  std::shared_ptr<MipsElfFile>::shared_ptr(&this->file);
  ghc::filesystem::path::path(&this->inputName);
  ghc::filesystem::path::path(&this->outputName);
  std::make_shared<MipsElfFile>();
  std::shared_ptr<MipsElfFile>::operator=(&this->file,&local_28);
  std::shared_ptr<MipsElfFile>::~shared_ptr(&local_28);
  getFullPathName(&local_58,local_18);
  this_02 = &this->inputName;
  ghc::filesystem::path::operator=(this_02,&local_58);
  ghc::filesystem::path::~path(&local_58);
  this_01 = std::__shared_ptr_access<MipsElfFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<MipsElfFile,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&this->file);
  bVar1 = MipsElfFile::load(this_01,this_02,this_02);
  this_00 = g_fileManager;
  if (bVar1) {
    std::shared_ptr<AssemblerFile>::shared_ptr<MipsElfFile,void>(&local_78,&this->file);
    FileManager::addFile(this_00,&local_78);
    std::shared_ptr<AssemblerFile>::~shared_ptr(&local_78);
  }
  else {
    std::shared_ptr<MipsElfFile>::shared_ptr(&local_68,(nullptr_t)0x0);
    std::shared_ptr<MipsElfFile>::operator=(&this->file,&local_68);
    std::shared_ptr<MipsElfFile>::~shared_ptr(&local_68);
  }
  return;
}

Assistant:

DirectiveLoadMipsElf::DirectiveLoadMipsElf(const fs::path& fileName)
{
	file = std::make_shared<MipsElfFile>();

	this->inputName = getFullPathName(fileName);
	if (!file->load(this->inputName,this->inputName))
	{
		file = nullptr;
		return;
	}
	
	g_fileManager->addFile(file);
}